

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.h
# Opt level: O1

void __thiscall
cfd::api::json::DecodeRawTransactionResponse::DecodeRawTransactionResponse
          (DecodeRawTransactionResponse *this,DecodeRawTransactionResponse *param_1)

{
  pointer pcVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  
  (this->super_JsonClassBase<cfd::api::json::DecodeRawTransactionResponse>)._vptr_JsonClassBase =
       (_func_int **)&PTR__DecodeRawTransactionResponse_007411e0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_Rb_tree(&(this->ignore_items)._M_t,&(param_1->ignore_items)._M_t);
  (this->txid_)._M_dataplus._M_p = (pointer)&(this->txid_).field_2;
  pcVar1 = (param_1->txid_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->txid_,pcVar1,pcVar1 + (param_1->txid_)._M_string_length);
  (this->hash_)._M_dataplus._M_p = (pointer)&(this->hash_).field_2;
  pcVar1 = (param_1->hash_)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->hash_,pcVar1,pcVar1 + (param_1->hash_)._M_string_length);
  this->locktime_ = param_1->locktime_;
  uVar2 = param_1->size_;
  uVar3 = param_1->vsize_;
  uVar4 = param_1->weight_;
  this->version_ = param_1->version_;
  this->size_ = uVar2;
  this->vsize_ = uVar3;
  this->weight_ = uVar4;
  std::
  vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
  ::vector(&(this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
            super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
           ,&(param_1->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>.
             super_vector<cfd::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::api::json::DecodeRawTransactionTxIn>_>
          );
  (this->vin_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxIn>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00741278;
  std::
  vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
  ::vector(&(this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
            super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
           ,&(param_1->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>.
             super_vector<cfd::api::json::DecodeRawTransactionTxOut,_std::allocator<cfd::api::json::DecodeRawTransactionTxOut>_>
          );
  (this->vout_).super_JsonVector<cfd::api::json::DecodeRawTransactionTxOut>._vptr_JsonVector =
       (_func_int **)&PTR__JsonVector_00741508;
  return;
}

Assistant:

DecodeRawTransactionResponse() {
    CollectFieldName();
  }